

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O2

StructValues<wasm::(anonymous_namespace)::FieldInfo> * __thiscall
wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
          (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *this,HeapType type)

{
  __node_base *p_Var1;
  size_type *psVar2;
  _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
  *this_00;
  bool bVar3;
  FieldInfo *__cur;
  _Hash_node_base *p_Var4;
  __buckets_ptr pp_Var5;
  __node_base_ptr p_Var6;
  Struct *pSVar7;
  pointer pFVar8;
  _Hash_node_base *p_Var9;
  long lVar10;
  ulong uVar11;
  size_type __bkt_count;
  ulong uVar12;
  _Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
  *heapType;
  _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
  *this_01;
  _Hash_node_base *p_Var14;
  size_t __n;
  HeapType HVar15;
  long lVar16;
  undefined1 auVar17 [16];
  _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
  local_98;
  anon_struct_8_0_00000001_for___align local_78;
  _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
  local_70;
  size_t local_58;
  _Scoped_node local_50;
  HeapType local_40;
  HeapType type_local;
  ulong uVar13;
  
  local_40.id = type.id;
  bVar3 = HeapType::isStruct(&local_40);
  if (!bVar3) {
    __assert_fail("type.isStruct()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/struct-utils.h"
                  ,0x35,
                  "StructValues<T> &wasm::StructUtils::StructValuesMap<wasm::(anonymous namespace)::FieldInfo>::operator[](HeapType) [T = wasm::(anonymous namespace)::FieldInfo]"
                 );
  }
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78 = (anon_struct_8_0_00000001_for___align)local_40.id;
  StructValues<wasm::(anonymous_namespace)::FieldInfo>::StructValues
            ((StructValues<wasm::(anonymous_namespace)::FieldInfo> *)&local_70,
             (StructValues<wasm::(anonymous_namespace)::FieldInfo> *)&local_98);
  local_50._M_h = (__hashtable_alloc *)this;
  local_50._M_node = (__node_ptr)operator_new(0x30);
  ((local_50._M_node)->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  heapType = &(local_50._M_node)->
              super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
  ;
  ((local_50._M_node)->
  super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>
  ._M_storage._M_storage.__align = local_78;
  *(pointer *)
   ((long)&((local_50._M_node)->
           super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>
           ._M_storage._M_storage + 8) = local_70._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&((local_50._M_node)->
           super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>
           ._M_storage._M_storage + 0x10) = local_70._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&((local_50._M_node)->
           super__Hash_node_value<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>
           ._M_storage._M_storage + 0x18) =
       local_70._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_70._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  type_local.id = (uintptr_t)local_50._M_node;
  p_Var4 = (_Hash_node_base *)
           std::hash<wasm::HeapType>::operator()((hash<wasm::HeapType> *)this,(HeapType *)heapType);
  uVar12 = (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           )._M_h._M_bucket_count;
  uVar11 = (ulong)p_Var4 % uVar12;
  p_Var6 = (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           )._M_h._M_buckets[uVar11];
  if (p_Var6 != (__node_base_ptr)0x0) {
    HVar15.id = (uintptr_t)p_Var6->_M_nxt;
    p_Var9 = ((_Hash_node_base *)(HVar15.id + 0x28))->_M_nxt;
    do {
      if ((p_Var9 == p_Var4) &&
         ((heapType->
          super__Hash_node_value_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>
          )._M_storage._M_storage.__align ==
          (anon_struct_8_0_00000001_for___align)((_Hash_node_base *)(HVar15.id + 8))->_M_nxt)) {
        bVar3 = false;
        goto LAB_00853807;
      }
      HVar15.id = (uintptr_t)((_Hash_node_base *)HVar15.id)->_M_nxt;
    } while (((_Hash_node_base *)HVar15.id != (_Hash_node_base *)0x0) &&
            (p_Var9 = ((_Hash_node_base *)(HVar15.id + 0x28))->_M_nxt,
            (ulong)p_Var9 % uVar12 == uVar11));
  }
  local_58 = (this->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             )._M_h._M_rehash_policy._M_next_resize;
  auVar17 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&(this->
                               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                               )._M_h._M_rehash_policy,uVar12,
                       (this->
                       super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                       )._M_h._M_element_count);
  __bkt_count = auVar17._8_8_;
  if ((auVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pp_Var5 = (this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              )._M_h._M_buckets;
  }
  else {
    pp_Var5 = std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_allocate_buckets
                        ((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)this,__bkt_count);
    p_Var1 = &(this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              )._M_h._M_before_begin;
    p_Var9 = (this->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             )._M_h._M_before_begin._M_nxt;
    (this->
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uVar12 = 0;
LAB_0085372d:
    p_Var14 = p_Var9;
    uVar11 = uVar12;
    if (p_Var14 != (_Hash_node_base *)0x0) {
      p_Var9 = p_Var14->_M_nxt;
      uVar12 = (ulong)p_Var14[5]._M_nxt % __bkt_count;
      if (pp_Var5[uVar12] == (__node_base_ptr)0x0) goto LAB_0085375e;
      p_Var14->_M_nxt = pp_Var5[uVar12]->_M_nxt;
      p_Var6 = pp_Var5[uVar12];
      uVar12 = uVar11;
      goto LAB_0085377d;
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_deallocate_buckets
              ((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)this);
    (this->
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    )._M_h._M_bucket_count = __bkt_count;
    (this->
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    )._M_h._M_buckets = pp_Var5;
    uVar11 = (ulong)p_Var4 % __bkt_count;
  }
  *(_Hash_node_base **)(type_local.id + 0x28) = p_Var4;
  if (pp_Var5[uVar11] == (__node_base_ptr)0x0) {
    p_Var4 = (this->
             super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
             )._M_h._M_before_begin._M_nxt;
    *(_Hash_node_base **)type_local.id = p_Var4;
    (this->
    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
    )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)type_local.id;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      pp_Var5[(ulong)p_Var4[5]._M_nxt %
              (this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              )._M_h._M_bucket_count] = (__node_base_ptr)type_local.id;
      pp_Var5 = (this->
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                )._M_h._M_buckets;
    }
    pp_Var5[uVar11] =
         &(this->
          super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
          )._M_h._M_before_begin;
  }
  else {
    *(_Hash_node_base **)type_local.id = pp_Var5[uVar11]->_M_nxt;
    pp_Var5[uVar11]->_M_nxt = (_Hash_node_base *)type_local.id;
  }
  psVar2 = &(this->
            super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
            )._M_h._M_element_count;
  *psVar2 = *psVar2 + 1;
  local_50._M_node = (__node_ptr)0x0;
  bVar3 = true;
  HVar15.id = type_local.id;
LAB_00853807:
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_50);
  std::
  _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
  ::~_Vector_base(&local_70);
  std::
  _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
  ::~_Vector_base(&local_98);
  if (bVar3) {
    pSVar7 = HeapType::getStruct(&local_40);
    uVar11 = (long)(pSVar7->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar7->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    p_Var4 = ((_Hash_node_base *)(HVar15.id + 0x18))->_M_nxt;
    lVar16 = (long)p_Var4 - (long)((_Hash_node_base *)(HVar15.id + 0x10))->_M_nxt;
    uVar12 = lVar16 >> 1;
    lVar10 = uVar12 - uVar11;
    if (uVar11 <= uVar12) {
      if ((uVar11 <= uVar12 && lVar10 != 0) &&
         (p_Var9 = (_Hash_node_base *)
                   ((long)&((_Hash_node_base *)(HVar15.id + 0x10))->_M_nxt->_M_nxt + uVar11 * 2),
         p_Var4 != p_Var9)) {
        ((_Hash_node_base *)(HVar15.id + 0x18))->_M_nxt = p_Var9;
      }
    }
    else {
      uVar11 = uVar11 - uVar12;
      if (uVar11 != 0) {
        __n = (long)((_Hash_node_base *)(HVar15.id + 0x20))->_M_nxt - (long)p_Var4 >> 1;
        if (__n < uVar11) {
          if ((uVar12 ^ 0x3fffffffffffffff) < uVar11) {
            std::__throw_length_error("vector::_M_default_append");
          }
          uVar13 = uVar11;
          if (uVar11 < uVar12) {
            uVar13 = uVar12;
          }
          this_01 = (_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     *)(uVar13 + uVar12);
          if ((_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
               *)0x3ffffffffffffffe < this_01) {
            this_01 = (_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                       *)0x3fffffffffffffff;
          }
          pFVar8 = std::
                   _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                   ::_M_allocate(this_01,__n);
          for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
            *(undefined2 *)((long)pFVar8 + uVar12 * 2 + lVar16) = 0;
          }
          this_00 = (_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     *)((_Hash_node_base *)(HVar15.id + 0x10))->_M_nxt;
          p_Var4 = ((_Hash_node_base *)(HVar15.id + 0x18))->_M_nxt;
          for (lVar10 = 0;
              p_Var9 = (_Hash_node_base *)
                       ((long)&(this_00->_M_impl).super__Vector_impl_data._M_start + lVar10),
              p_Var9 != p_Var4; lVar10 = lVar10 + 2) {
            *(undefined2 *)(&pFVar8->hasWrite + lVar10) = *(undefined2 *)&p_Var9->_M_nxt;
          }
          std::
          _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
          ::_M_deallocate(this_00,(pointer)((long)((_Hash_node_base *)(HVar15.id + 0x20))->_M_nxt -
                                            (long)this_00 >> 1),(size_t)p_Var9);
          ((_Hash_node_base *)(HVar15.id + 0x10))->_M_nxt = (_Hash_node_base *)pFVar8;
          ((_Hash_node_base *)(HVar15.id + 0x18))->_M_nxt =
               (_Hash_node_base *)((long)pFVar8 + uVar11 * 2 + lVar16);
          ((_Hash_node_base *)(HVar15.id + 0x20))->_M_nxt =
               (_Hash_node_base *)(pFVar8 + (long)this_01);
        }
        else {
          for (; lVar10 != 0; lVar10 = lVar10 + 1) {
            *(undefined2 *)&p_Var4->_M_nxt = 0;
            p_Var4 = (_Hash_node_base *)((long)&p_Var4->_M_nxt + 2);
          }
          ((_Hash_node_base *)(HVar15.id + 0x18))->_M_nxt = p_Var4;
        }
      }
    }
  }
  return (StructValues<wasm::(anonymous_namespace)::FieldInfo> *)(HVar15.id + 0x10);
LAB_0085375e:
  p_Var14->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = p_Var14;
  pp_Var5[uVar12] = p_Var1;
  if (p_Var14->_M_nxt != (_Hash_node_base *)0x0) {
    p_Var6 = (__node_base_ptr)(pp_Var5 + uVar11);
LAB_0085377d:
    p_Var6->_M_nxt = p_Var14;
  }
  goto LAB_0085372d;
}

Assistant:

StructValues<T>& operator[](HeapType type) {
    assert(type.isStruct());
    auto inserted = this->insert({type, {}});
    auto& values = inserted.first->second;
    if (inserted.second) {
      values.resize(type.getStruct().fields.size());
    }
    return values;
  }